

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O2

void __thiscall
crypto_tests::CryptoTest::TestFSChaCha20Poly1305
          (CryptoTest *this,string *plain_hex,string *aad_hex,string *key_hex,uint64_t msg_idx,
          string *cipher_hex)

{
  long lVar1;
  Span<std::byte> cipher_00;
  Span<const_std::byte> aad_00;
  Span<std::byte> cipher_01;
  Span<std::byte> plain1;
  Span<std::byte> plain1_00;
  Span<std::byte> cipher_02;
  Span<std::byte> plain2;
  readonly_property65 rVar2;
  readonly_property<bool> rVar3;
  size_t sVar4;
  int iVar5;
  byte *pbVar6;
  iterator pvVar7;
  iterator pvVar8;
  string *psVar9;
  element_type *peVar10;
  uint64_t uVar11;
  long in_FS_OFFSET;
  bool bVar12;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  string_view hex_str;
  string_view hex_str_00;
  string_view hex_str_01;
  string_view hex_str_02;
  Span<const_std::byte> key_00;
  Span<const_std::byte> plain_00;
  Span<const_std::byte> plain1_01;
  Span<const_std::byte> plain_01;
  const_string file;
  Span<const_std::byte> key_01;
  Span<const_std::byte> cipher_03;
  Span<const_std::byte> cipher_04;
  const_string file_00;
  const_string file_01;
  Span<const_std::byte> aad_01;
  Span<const_std::byte> plain2_00;
  Span<const_std::byte> aad_02;
  Span<const_std::byte> aad_03;
  Span<const_std::byte> aad_04;
  check_type cVar13;
  char *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  assertion_result local_2d8;
  char **local_2c0;
  pointer local_2b0;
  element_type *peStack_2a8;
  shared_count sStack_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  byte *local_278;
  size_t sStack_270;
  pointer local_268;
  element_type *peStack_260;
  vector<std::byte,_std::allocator<std::byte>_> decipher;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  pointer local_210;
  size_t sStack_208;
  pointer local_200;
  check_type cStack_1f8;
  pointer local_1f0;
  check_type cStack_1e8;
  byte *local_1e0;
  undefined8 uStack_1d8;
  vector<std::byte,_std::allocator<std::byte>_> cipher;
  vector<std::byte,_std::allocator<std::byte>_> expected_cipher;
  vector<std::byte,_std::allocator<std::byte>_> key;
  vector<std::byte,_std::allocator<std::byte>_> aad;
  vector<std::byte,_std::allocator<std::byte>_> plain;
  FSChaCha20Poly1305 dec_aead;
  FSChaCha20Poly1305 enc_aead;
  byte dummy_tag [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  hex_str._M_str = (plain_hex->_M_dataplus)._M_p;
  hex_str._M_len = plain_hex->_M_string_length;
  psVar9 = cipher_hex;
  ParseHex<std::byte>(&plain,hex_str);
  hex_str_00._M_str = (aad_hex->_M_dataplus)._M_p;
  hex_str_00._M_len = aad_hex->_M_string_length;
  ParseHex<std::byte>(&aad,hex_str_00);
  hex_str_01._M_str = (key_hex->_M_dataplus)._M_p;
  hex_str_01._M_len = key_hex->_M_string_length;
  ParseHex<std::byte>(&key,hex_str_01);
  hex_str_02._M_str = (cipher_hex->_M_dataplus)._M_p;
  hex_str_02._M_len = cipher_hex->_M_string_length;
  ParseHex<std::byte>(&expected_cipher,hex_str_02);
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            (&cipher,(size_type)
                     (plain.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_finish +
                     (0x10 - (long)plain.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                   _M_impl.super__Vector_impl_data._M_start)),
             (allocator_type *)&enc_aead);
  for (iVar5 = 0; iVar5 != 10; iVar5 = iVar5 + 1) {
    peVar10 = (element_type *)
              (plain.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish +
              -(long)plain.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                     super__Vector_impl_data._M_start);
    if (iVar5 != 0) {
      peVar10 = (element_type *)
                RandomMixin<FastRandomContext>::randrange<unsigned_long>
                          (&(this->super_BasicTestingSetup).m_rng.
                            super_RandomMixin<FastRandomContext>,
                           (unsigned_long)
                           ((long)&(peVar10->m_stream).
                                   super_basic_ostream<char,_std::char_traits<char>_>.
                                   _vptr_basic_ostream + 1));
    }
    dummy_tag[0] = 0;
    dummy_tag[1] = 0;
    dummy_tag[2] = 0;
    dummy_tag[3] = 0;
    dummy_tag[4] = 0;
    dummy_tag[5] = 0;
    dummy_tag[6] = 0;
    dummy_tag[7] = 0;
    dummy_tag[8] = 0;
    dummy_tag[9] = 0;
    dummy_tag[10] = 0;
    dummy_tag[0xb] = 0;
    dummy_tag[0xc] = 0;
    dummy_tag[0xd] = 0;
    dummy_tag[0xe] = 0;
    dummy_tag[0xf] = 0;
    key_00.m_size =
         (long)key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start;
    key_00.m_data =
         key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
    FSChaCha20Poly1305::FSChaCha20Poly1305(&enc_aead,key_00,0xe0);
    uVar11 = msg_idx;
    while (bVar12 = uVar11 != 0, uVar11 = uVar11 - 1, bVar12) {
      uStack_1d8 = 0x10;
      cipher_00.m_size._0_4_ = 0x10;
      cipher_00.m_data = dummy_tag;
      cipher_00.m_size._4_4_ = 0;
      plain_00.m_size = 0;
      plain_00.m_data = dummy_tag;
      aad_01.m_size = 0;
      aad_01.m_data = dummy_tag;
      local_1e0 = dummy_tag;
      FSChaCha20Poly1305::Encrypt(&enc_aead,plain_00,aad_01,cipher_00);
    }
    if (iVar5 == 0) {
      plain2_00.m_size =
           aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_finish +
           -(long)aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_1f0 = cipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_start;
      _cStack_1e8 = (check_type)
                    ((long)cipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)cipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                          super__Vector_impl_data._M_start);
      cipher_01.m_size._0_4_ = (check_type)_cStack_1e8;
      cipher_01.m_data =
           cipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start;
      cipher_01.m_size._4_4_ = (int)((ulong)_cStack_1e8 >> 0x20);
      plain_01.m_size =
           (long)plain.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)plain.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_start;
      plain_01.m_data =
           plain.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start;
      aad_02.m_size = (size_t)plain2_00.m_size;
      aad_02.m_data =
           aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start;
      _cVar13 = _cStack_1e8;
      FSChaCha20Poly1305::Encrypt(&enc_aead,plain_01,aad_02,cipher_01);
    }
    else {
      plain2_00.m_size =
           plain.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_finish +
           -(long)(plain.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_start + (long)peVar10);
      local_200 = aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_start;
      _cStack_1f8 = (check_type)
                    ((long)aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                          super__Vector_impl_data._M_start);
      local_210 = cipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_start;
      sStack_208 = (long)cipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)cipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                         super__Vector_impl_data._M_start;
      aad_00.m_size._0_4_ = (check_type)_cStack_1f8;
      aad_00.m_data =
           aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start;
      aad_00.m_size._4_4_ = (int)((ulong)_cStack_1f8 >> 0x20);
      cipher_02.m_size = sStack_208;
      cipher_02.m_data =
           cipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start;
      plain1_01.m_size = (size_t)peVar10;
      plain1_01.m_data =
           plain.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start;
      plain2_00.m_data =
           plain.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start + (long)peVar10;
      _cVar13 = _cStack_1f8;
      FSChaCha20Poly1305::Encrypt(&enc_aead,plain1_01,plain2_00,aad_00,cipher_02);
    }
    local_220 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_218 = "";
    local_230 = &boost::unit_test::basic_cstring<char_const>::null;
    local_228 = &boost::unit_test::basic_cstring<char_const>::null;
    msg.m_end = (iterator)psVar9;
    msg.m_begin = (iterator)plain2_00.m_size;
    file.m_end = (iterator)0x140;
    file.m_begin = (iterator)&local_220;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_230,msg);
    rVar2.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)std::operator==(&cipher,&expected_cipher);
    local_2d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         rVar2.super_readonly_property<bool>.super_class_property<bool>.value;
    local_2d8.m_message.px = (element_type *)0x0;
    local_2d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    decipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_55f9ee;
    decipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xb7a96b;
    dec_aead.m_aead.m_chacha20.m_aligned.input[2]._0_1_ = 0;
    dec_aead.m_aead.m_chacha20.m_aligned.input._0_8_ = &PTR__lazy_ostream_0113a070;
    dec_aead.m_aead.m_chacha20.m_aligned.input._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_240 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_238 = "";
    pvVar7 = (iterator)0x0;
    dec_aead.m_aead.m_chacha20.m_aligned.input._24_8_ = &decipher;
    boost::test_tools::tt_detail::report_assertion
              (&local_2d8,(lazy_ostream *)&dec_aead,1,0,WARN,_cVar13,(size_t)&local_240,0x140);
    boost::detail::shared_count::~shared_count(&local_2d8.m_message.pn);
    key_01.m_size =
         (long)key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start;
    key_01.m_data =
         key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
    FSChaCha20Poly1305::FSChaCha20Poly1305(&dec_aead,key_01,0xe0);
    uVar11 = msg_idx;
    while (bVar12 = uVar11 != 0, uVar11 = uVar11 - 1, bVar12) {
      decipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2d8._0_8_ = (_func_int **)0x0;
      local_2d8.m_message.px = (element_type *)0x0;
      plain1.m_size = 0;
      plain1.m_data = dummy_tag;
      cipher_03.m_size = 0x10;
      cipher_03.m_data = dummy_tag;
      aad_03.m_size = 0;
      aad_03.m_data = dummy_tag;
      decipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start = dummy_tag;
      FSChaCha20Poly1305::Decrypt(&dec_aead,cipher_03,aad_03,plain1,(Span<std::byte>)ZEXT816(0));
    }
    std::vector<std::byte,_std::allocator<std::byte>_>::vector
              (&decipher,
               (size_type)
               (cipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish +
               (-0x10 - (long)cipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start)),
               (allocator_type *)&local_2d8);
    cipher_04.m_size =
         (long)cipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)cipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start;
    aad_04.m_size =
         aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_finish +
         -(long)aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start;
    if (iVar5 == 0) {
      peStack_2a8 = (element_type *)
                    (decipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                     super__Vector_impl_data._M_finish +
                    -(long)decipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                           _M_impl.super__Vector_impl_data._M_start);
      local_2b0 = decipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_2d8._0_8_ = (_func_int **)0x0;
      local_2d8.m_message.px = (element_type *)0x0;
      pbVar6 = (byte *)0x0;
      sVar4 = 0;
      peVar10 = peStack_2a8;
    }
    else {
      local_268 = decipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_start;
      pbVar6 = decipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start + (long)peVar10;
      sVar4 = (long)decipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pbVar6;
      local_278 = pbVar6;
      sStack_270 = sVar4;
      peStack_260 = peVar10;
    }
    plain1_00.m_size._0_4_ = (check_type)peVar10;
    plain1_00.m_data =
         decipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
    plain1_00.m_size._4_4_ = (int)((ulong)peVar10 >> 0x20);
    plain2.m_size = sVar4;
    plain2.m_data = pbVar6;
    cipher_04.m_data =
         cipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
    aad_04.m_data =
         aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
    rVar3.super_class_property<bool>.value =
         (class_property<bool>)
         FSChaCha20Poly1305::Decrypt(&dec_aead,cipher_04,aad_04,plain1_00,plain2);
    local_288 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_280 = "";
    local_298 = &boost::unit_test::basic_cstring<char_const>::null;
    local_290 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_00.m_end = pvVar7;
    msg_00.m_begin = (iterator)aad_04.m_size;
    file_00.m_end = (iterator)0x150;
    file_00.m_begin = (iterator)&local_288;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_298,
               msg_00);
    peStack_2a8 = (element_type *)0x0;
    sStack_2a0.pi_ = (sp_counted_base *)0x0;
    local_2e8 = "ret";
    local_2e0 = "";
    local_2d8.m_message.px = (element_type *)((ulong)local_2d8.m_message.px & 0xffffffffffffff00);
    local_2d8._0_8_ = &PTR__lazy_ostream_0113a070;
    local_2d8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_2c0 = &local_2e8;
    local_2f8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_2f0 = "";
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    local_2b0._0_1_ = rVar3.super_class_property<bool>.value;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_2b0,(lazy_ostream *)&local_2d8,1,0,WARN,
               (check_type)peVar10,(size_t)&local_2f8,0x150);
    boost::detail::shared_count::~shared_count(&sStack_2a0);
    local_308 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_300 = "";
    local_318 = &boost::unit_test::basic_cstring<char_const>::null;
    local_310 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_01.m_end = pvVar8;
    msg_01.m_begin = pvVar7;
    file_01.m_end = (iterator)0x151;
    file_01.m_begin = (iterator)&local_308;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_318,
               msg_01);
    bVar12 = std::operator==((vector<std::byte,_std::allocator<std::byte>_> *)
                             &decipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>,
                             &plain);
    local_2b0 = (pointer)CONCAT71(local_2b0._1_7_,bVar12);
    peStack_2a8 = (element_type *)0x0;
    sStack_2a0.pi_ = (sp_counted_base *)0x0;
    local_2e8 = "decipher == plain";
    local_2e0 = "";
    local_2d8.m_message.px = (element_type *)((ulong)local_2d8.m_message.px & 0xffffffffffffff00);
    local_2d8._0_8_ = &PTR__lazy_ostream_0113a070;
    local_2d8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_2c0 = &local_2e8;
    local_328 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_320 = "";
    psVar9 = (string *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_2b0,(lazy_ostream *)&local_2d8,1,0,WARN,
               (check_type)peVar10,(size_t)&local_328,0x151);
    boost::detail::shared_count::~shared_count(&sStack_2a0);
    std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
              (&decipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
    ChaCha20::~ChaCha20((ChaCha20 *)&dec_aead);
    ChaCha20::~ChaCha20((ChaCha20 *)&enc_aead);
  }
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&cipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&expected_cipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&key.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&plain.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TestFSChaCha20Poly1305(const std::string& plain_hex, const std::string& aad_hex, const std::string& key_hex, uint64_t msg_idx, const std::string& cipher_hex)
{
    auto plain = ParseHex<std::byte>(plain_hex);
    auto aad = ParseHex<std::byte>(aad_hex);
    auto key = ParseHex<std::byte>(key_hex);
    auto expected_cipher = ParseHex<std::byte>(cipher_hex);
    std::vector<std::byte> cipher(plain.size() + FSChaCha20Poly1305::EXPANSION);

    for (int it = 0; it < 10; ++it) {
        // During it==0 we use the single-plain Encrypt/Decrypt; others use a split at prefix.
        size_t prefix = it ? m_rng.randrange(plain.size() + 1) : plain.size();
        std::byte dummy_tag[FSChaCha20Poly1305::EXPANSION] = {{}};

        // Do msg_idx dummy encryptions to seek to the correct packet.
        FSChaCha20Poly1305 enc_aead{key, 224};
        for (uint64_t i = 0; i < msg_idx; ++i) {
            enc_aead.Encrypt(Span{dummy_tag}.first(0), Span{dummy_tag}.first(0), dummy_tag);
        }

        // Invoke single-plain or plain1/plain2 Encrypt.
        if (it == 0) {
            enc_aead.Encrypt(plain, aad, cipher);
        } else {
            enc_aead.Encrypt(Span{plain}.first(prefix), Span{plain}.subspan(prefix), aad, cipher);
        }
        BOOST_CHECK(cipher == expected_cipher);

        // Do msg_idx dummy decryptions to seek to the correct packet.
        FSChaCha20Poly1305 dec_aead{key, 224};
        for (uint64_t i = 0; i < msg_idx; ++i) {
            dec_aead.Decrypt(dummy_tag, Span{dummy_tag}.first(0), Span{dummy_tag}.first(0));
        }

        // Invoke single-plain or plain1/plain2 Decrypt.
        std::vector<std::byte> decipher(cipher.size() - AEADChaCha20Poly1305::EXPANSION);
        bool ret{false};
        if (it == 0) {
            ret = dec_aead.Decrypt(cipher, aad, decipher);
        } else {
            ret = dec_aead.Decrypt(cipher, aad, Span{decipher}.first(prefix), Span{decipher}.subspan(prefix));
        }
        BOOST_CHECK(ret);
        BOOST_CHECK(decipher == plain);
    }
}